

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatInvalidInputTest_::
InvalidSubMessage<proto2_unittest::TestAllTypes>::~InvalidSubMessage
          (InvalidSubMessage<proto2_unittest::TestAllTypes> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatInvalidInputTest, InvalidSubMessage) {
  typename TestFixture::TestAllTypes message;

  // Control case.
  EXPECT_TRUE(message.ParseFromString(this->MakeInvalidEmbeddedMessage("", 0)));

  // The byte is a valid varint, but not a valid tag (zero).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\0", 1)));

  // The byte is a malformed varint.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\200", 1)));

  // The byte is an endgroup tag, but we aren't parsing a group.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\014", 1)));

  // The byte is a valid varint but not a valid tag (bad wire type).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\017", 1)));
}